

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O2

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::scan
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  Char *pCVar1;
  bool bVar2;
  pointer pCVar3;
  Char *pCVar4;
  
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ::resize(&this->props_,
           (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2);
  pCVar3 = (this->props_).
           super__Vector_base<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar4 = (this->item_).super__Vector_base<char32_t,_std::allocator<char32_t>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar4 != pCVar1; pCVar4 = pCVar4 + 1) {
    bVar2 = Utf8StringTraits::is_uppercase(*pCVar4);
    pCVar3->uppercase = bVar2;
    pCVar3 = pCVar3 + 1;
  }
  if (this->case_sensitive_ != false) {
    bVar2 = scan_match<true>(this);
    return bVar2;
  }
  bVar2 = scan_match<false>(this);
  return bVar2;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }